

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::DockNodeCalcDropRectsAndTestMousePos
               (ImRect *parent,ImGuiDir dir,ImRect *out_r,bool outer_docking,ImVec2 *test_mouse_pos)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiDir IVar3;
  float fVar4;
  float fVar5;
  float r_threshold_sides;
  float r_threshold_center;
  float mouse_delta_len2;
  ImVec2 mouse_delta;
  ImRect hit_r;
  ImVec2 local_c0;
  ImRect local_b8;
  ImRect local_a8;
  ImRect local_98;
  ImRect local_88;
  ImVec2 local_78;
  ImVec2 local_70;
  ImVec2 c;
  ImVec2 local_60;
  ImVec2 local_58;
  ImVec2 off;
  float hs_h;
  float hs_w;
  float hs_for_central_nodes;
  float parent_smaller_axis;
  ImGuiContext *g;
  ImVec2 *test_mouse_pos_local;
  bool outer_docking_local;
  ImRect *out_r_local;
  ImGuiDir dir_local;
  ImRect *parent_local;
  
  pIVar1 = GImGui;
  fVar4 = ImRect::GetWidth(parent);
  fVar5 = ImRect::GetHeight(parent);
  fVar5 = ImMin<float>(fVar4,fVar5);
  fVar4 = pIVar1->FontSize;
  fVar5 = ImMax<float>(pIVar1->FontSize * 0.5,fVar5 / 8.0);
  fVar4 = ImMin<float>(fVar4 * 1.5,fVar5);
  ImVec2::ImVec2(&local_58);
  if (outer_docking) {
    off.y = ImFloor(fVar4 * 1.5);
    off.x = ImFloor(fVar4 * 0.8);
    fVar4 = ImRect::GetWidth(parent);
    fVar4 = ImFloor(fVar4 * 0.5 + -off.x);
    fVar5 = ImRect::GetHeight(parent);
    fVar5 = ImFloor(fVar5 * 0.5 + -off.x);
    ImVec2::ImVec2(&local_60,fVar4,fVar5);
    local_58 = local_60;
  }
  else {
    off.y = ImFloor(fVar4);
    off.x = ImFloor(fVar4 * 0.9);
    fVar4 = ImFloor(off.y * 2.4);
    fVar5 = ImFloor(off.y * 2.4);
    ImVec2::ImVec2(&c,fVar4,fVar5);
    local_58 = c;
  }
  local_78 = ImRect::GetCenter(parent);
  local_70 = ImFloor(&local_78);
  if (dir == -1) {
    ImRect::ImRect(&local_88,local_70.x - off.y,local_70.y - off.y,local_70.x + off.y,
                   local_70.y + off.y);
    out_r->Min = local_88.Min;
    out_r->Max = local_88.Max;
  }
  else if (dir == 2) {
    ImRect::ImRect(&local_98,local_70.x - off.y,(local_70.y - local_58.y) - off.x,local_70.x + off.y
                   ,(local_70.y - local_58.y) + off.x);
    out_r->Min = local_98.Min;
    out_r->Max = local_98.Max;
  }
  else if (dir == 3) {
    ImRect::ImRect(&local_a8,local_70.x - off.y,(local_70.y + local_58.y) - off.x,local_70.x + off.y
                   ,local_70.y + local_58.y + off.x);
    out_r->Min = local_a8.Min;
    out_r->Max = local_a8.Max;
  }
  else if (dir == 0) {
    ImRect::ImRect(&local_b8,(local_70.x - local_58.x) - off.x,local_70.y - off.y,
                   (local_70.x - local_58.x) + off.x,local_70.y + off.y);
    out_r->Min = local_b8.Min;
    out_r->Max = local_b8.Max;
  }
  else if (dir == 1) {
    ImRect::ImRect((ImRect *)&hit_r.Max,(local_70.x + local_58.x) - off.x,local_70.y - off.y,
                   local_70.x + local_58.x + off.x,local_70.y + off.y);
    out_r->Min = hit_r.Max;
    out_r->Max = local_c0;
  }
  if (test_mouse_pos == (ImVec2 *)0x0) {
    return false;
  }
  mouse_delta = out_r->Min;
  hit_r.Min = out_r->Max;
  if (!outer_docking) {
    fVar4 = ImFloor(off.y * 0.3);
    ImRect::Expand((ImRect *)&mouse_delta,fVar4);
    _r_threshold_center = operator-(test_mouse_pos,&local_70);
    fVar4 = ImLengthSqr((ImVec2 *)&r_threshold_center);
    if (fVar4 < off.y * 1.4 * off.y * 1.4) {
      return dir == -1;
    }
    if (fVar4 < off.y * 2.6 * off.y * 2.6) {
      IVar3 = ImGetDirQuadrantFromDelta(r_threshold_center,mouse_delta_len2);
      return dir == IVar3;
    }
  }
  bVar2 = ImRect::Contains((ImRect *)&mouse_delta,test_mouse_pos);
  return bVar2;
}

Assistant:

bool ImGui::DockNodeCalcDropRectsAndTestMousePos(const ImRect& parent, ImGuiDir dir, ImRect& out_r, bool outer_docking, ImVec2* test_mouse_pos)
{
    ImGuiContext& g = *GImGui;

    const float parent_smaller_axis = ImMin(parent.GetWidth(), parent.GetHeight());
    const float hs_for_central_nodes = ImMin(g.FontSize * 1.5f, ImMax(g.FontSize * 0.5f, parent_smaller_axis / 8.0f));
    float hs_w; // Half-size, longer axis
    float hs_h; // Half-size, smaller axis
    ImVec2 off; // Distance from edge or center
    if (outer_docking)
    {
        //hs_w = ImFloor(ImClamp(parent_smaller_axis - hs_for_central_nodes * 4.0f, g.FontSize * 0.5f, g.FontSize * 8.0f));
        //hs_h = ImFloor(hs_w * 0.15f);
        //off = ImVec2(ImFloor(parent.GetWidth() * 0.5f - GetFrameHeightWithSpacing() * 1.4f - hs_h), ImFloor(parent.GetHeight() * 0.5f - GetFrameHeightWithSpacing() * 1.4f - hs_h));
        hs_w = ImFloor(hs_for_central_nodes * 1.50f);
        hs_h = ImFloor(hs_for_central_nodes * 0.80f);
        off = ImVec2(ImFloor(parent.GetWidth() * 0.5f - hs_h), ImFloor(parent.GetHeight() * 0.5f - hs_h));
    }
    else
    {
        hs_w = ImFloor(hs_for_central_nodes);
        hs_h = ImFloor(hs_for_central_nodes * 0.90f);
        off = ImVec2(ImFloor(hs_w * 2.40f), ImFloor(hs_w * 2.40f));
    }

    ImVec2 c = ImFloor(parent.GetCenter());
    if      (dir == ImGuiDir_None)  { out_r = ImRect(c.x - hs_w, c.y - hs_w,         c.x + hs_w, c.y + hs_w);         }
    else if (dir == ImGuiDir_Up)    { out_r = ImRect(c.x - hs_w, c.y - off.y - hs_h, c.x + hs_w, c.y - off.y + hs_h); }
    else if (dir == ImGuiDir_Down)  { out_r = ImRect(c.x - hs_w, c.y + off.y - hs_h, c.x + hs_w, c.y + off.y + hs_h); }
    else if (dir == ImGuiDir_Left)  { out_r = ImRect(c.x - off.x - hs_h, c.y - hs_w, c.x - off.x + hs_h, c.y + hs_w); }
    else if (dir == ImGuiDir_Right) { out_r = ImRect(c.x + off.x - hs_h, c.y - hs_w, c.x + off.x + hs_h, c.y + hs_w); }

    if (test_mouse_pos == NULL)
        return false;

    ImRect hit_r = out_r;
    if (!outer_docking)
    {
        // Custom hit testing for the 5-way selection, designed to reduce flickering when moving diagonally between sides
        hit_r.Expand(ImFloor(hs_w * 0.30f));
        ImVec2 mouse_delta = (*test_mouse_pos - c);
        float mouse_delta_len2 = ImLengthSqr(mouse_delta);
        float r_threshold_center = hs_w * 1.4f;
        float r_threshold_sides = hs_w * (1.4f + 1.2f);
        if (mouse_delta_len2 < r_threshold_center * r_threshold_center)
            return (dir == ImGuiDir_None);
        if (mouse_delta_len2 < r_threshold_sides * r_threshold_sides)
            return (dir == ImGetDirQuadrantFromDelta(mouse_delta.x, mouse_delta.y));
    }
    return hit_r.Contains(*test_mouse_pos);
}